

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::focusInEvent(QAbstractItemView *this,QFocusEvent *event)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  QAbstractItemViewPrivate *pQVar5;
  QItemSelectionModel *this_00;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool autoScroll;
  bool currentIndexValid;
  QItemSelectionModel *model;
  QAbstractItemViewPrivate *d;
  QModelIndex index;
  QWidget *in_stack_ffffffffffffff68;
  bool local_81;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined1 *local_38;
  undefined1 *in_stack_ffffffffffffffd0;
  QWidget *in_stack_ffffffffffffffd8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QAbstractItemView *)0x8076b5);
  QWidget::focusInEvent((QWidget *)in_RDI,(QFocusEvent *)in_stack_ffffffffffffff68);
  this_00 = selectionModel((QAbstractItemView *)in_RDI);
  currentIndex((QAbstractItemView *)this_00);
  local_81 = QModelIndex::isValid((QModelIndex *)in_RDI);
  if (((this_00 != (QItemSelectionModel *)0x0) && ((pQVar5->currentIndexSet & 1U) == 0)) &&
     (!local_81)) {
    bVar1 = pQVar5->autoScroll;
    pQVar5->autoScroll = false;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_ffffffffffffffd0 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_ffffffffffffffd8 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QFlags<Qt::KeyboardModifier>::QFlags
              ((QFlags<Qt::KeyboardModifier> *)in_RDI,
               (KeyboardModifier)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                           super_QWidgetPrivate + 0x2a8))(&local_38,in_RDI,8,local_3c);
    bVar3 = QModelIndex::isValid((QModelIndex *)in_RDI);
    if (((bVar3) &&
        (bVar3 = QAbstractItemViewPrivate::isIndexEnabled
                           (in_RDI,(QModelIndex *)in_stack_ffffffffffffff68), bVar3)) &&
       (iVar4 = QFocusEvent::reason(), iVar4 != 0)) {
      in_stack_ffffffffffffff68 = (QWidget *)selectionModel((QAbstractItemView *)in_RDI);
      QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                ((QFlags<QItemSelectionModel::SelectionFlag> *)in_RDI,
                 (SelectionFlag)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      (**(code **)(*(long *)in_stack_ffffffffffffff68 + 0x60))
                (in_stack_ffffffffffffff68,&local_38,local_40);
      local_81 = true;
    }
    pQVar5->autoScroll = (bool)(bVar1 & 1);
  }
  if ((this_00 == (QItemSelectionModel *)0x0) || (local_81 == false)) {
    if (local_81 == false) {
      QWidget::setAttribute
                (in_stack_ffffffffffffffd8,
                 (WidgetAttribute)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x18,0));
    }
  }
  else {
    currentIndex((QAbstractItemView *)this_00);
    QModelIndex::flags((QModelIndex *)in_RDI);
    local_44.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)in_RDI,
                    (ItemFlag)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
    QWidget::setAttribute
              (in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)in_stack_ffffffffffffffd0 >> 0x20)
               ,SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x18,0));
  }
  QWidget::update(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::focusInEvent(QFocusEvent *event)
{
    Q_D(QAbstractItemView);
    QAbstractScrollArea::focusInEvent(event);

    const QItemSelectionModel* model = selectionModel();
    bool currentIndexValid = currentIndex().isValid();

    if (model
        && !d->currentIndexSet
        && !currentIndexValid) {
        bool autoScroll = d->autoScroll;
        d->autoScroll = false;
        QModelIndex index = moveCursor(MoveNext, Qt::NoModifier); // first visible index
        if (index.isValid() && d->isIndexEnabled(index) && event->reason() != Qt::MouseFocusReason) {
            selectionModel()->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
            currentIndexValid = true;
        }
        d->autoScroll = autoScroll;
    }

    if (model && currentIndexValid)
        setAttribute(Qt::WA_InputMethodEnabled, (currentIndex().flags() & Qt::ItemIsEditable));
    else if (!currentIndexValid)
        setAttribute(Qt::WA_InputMethodEnabled, false);

    d->viewport->update();
}